

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDocked(ImGuiWindow *window,bool *p_open)

{
  bool bVar1;
  bool bVar2;
  ImGuiID IVar3;
  int iVar4;
  ImVec2 *pos;
  byte local_51;
  ImGuiWindow *parent_window;
  ImGuiDockNode *local_40;
  ImGuiDockNode *root_node;
  ImGuiDockNode *node;
  bool want_undock;
  ImGuiContext *pIStack_28;
  bool auto_dock_node;
  ImGuiContext *g;
  ImGuiContext *ctx;
  bool *p_open_local;
  ImGuiWindow *window_local;
  
  g = GImGui;
  pIStack_28 = GImGui;
  ctx = (ImGuiContext *)p_open;
  p_open_local = (bool *)window;
  node._7_1_ = GetWindowAlwaysWantOwnTabBar(window);
  if ((bool)node._7_1_) {
    if (*(int *)(p_open_local + 0x478) == 0) {
      if (*(long *)(p_open_local + 0x468) != 0) {
        __assert_fail("window->DockNode == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a2b,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      IVar3 = DockContextGenNodeID(g);
      *(ImGuiID *)(p_open_local + 0x478) = IVar3;
    }
  }
  else {
    bVar2 = (*(uint *)(p_open_local + 0xc) & 0x200000) != 0;
    local_51 = 0;
    if ((((pIStack_28->NextWindowData).Flags & 1U) != 0) &&
       (local_51 = 0, (*(uint *)(p_open_local + 0xe4) & (pIStack_28->NextWindowData).PosCond) != 0))
    {
      local_51 = (pIStack_28->NextWindowData).PosUndock;
    }
    bVar1 = (local_51 & 1) != 0;
    node._6_1_ = bVar2 || bVar1;
    if (bVar2 || bVar1) {
      DockContextProcessUndockWindow(g,(ImGuiWindow *)p_open_local,true);
      return;
    }
  }
  root_node = *(ImGuiDockNode **)(p_open_local + 0x468);
  if ((root_node != (ImGuiDockNode *)0x0) && (*(ImGuiID *)(p_open_local + 0x478) != root_node->ID))
  {
    __assert_fail("window->DockId == node->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a3f,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (((*(int *)(p_open_local + 0x478) == 0) || (root_node != (ImGuiDockNode *)0x0)) ||
     (root_node = DockContextBindNodeToWindow(g,(ImGuiWindow *)p_open_local),
     root_node != (ImGuiDockNode *)0x0)) {
    if (root_node->LastFrameAlive < pIStack_28->FrameCount) {
      local_40 = DockNodeGetRootNode(root_node);
      if (local_40->LastFrameAlive < pIStack_28->FrameCount) {
        DockContextProcessUndockWindow(g,(ImGuiWindow *)p_open_local,true);
      }
      else {
        p_open_local[0x492] = (bool)(p_open_local[0x492] & 0xfeU | 1);
        p_open_local[0x492] = (bool)(p_open_local[0x492] & 0xfd);
      }
    }
    else if (root_node->HostWindow == (ImGuiWindow *)0x0) {
      p_open_local[0x492] =
           (bool)(p_open_local[0x492] & 0xfeU |
                 root_node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing);
      p_open_local[0x492] = (bool)(p_open_local[0x492] & 0xfd);
    }
    else {
      if (root_node->HostWindow == (ImGuiWindow *)0x0) {
        __assert_fail("node->HostWindow",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a6d,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      bVar2 = ImGuiDockNode::IsLeafNode(root_node);
      if (!bVar2) {
        __assert_fail("node->IsLeafNode()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a6e,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      bVar2 = false;
      if (0.0 <= (root_node->Size).x) {
        bVar2 = 0.0 <= (root_node->Size).y;
      }
      if (!bVar2) {
        __assert_fail("node->Size.x >= 0.0f && node->Size.y >= 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a6f,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      root_node->State = ImGuiDockNodeState_HostWindowVisible;
      if (*(short *)(p_open_local + 0xce) < root_node->HostWindow->BeginOrderWithinContext) {
        DockContextProcessUndockWindow(g,(ImGuiWindow *)p_open_local,true);
      }
      else {
        pos = &root_node->Pos;
        ImVec2::ImVec2((ImVec2 *)&parent_window,0.0,0.0);
        SetNextWindowPos(pos,0,(ImVec2 *)&parent_window);
        SetNextWindowSize(&root_node->Size,0);
        (pIStack_28->NextWindowData).PosUndock = false;
        p_open_local[0x492] = (bool)(p_open_local[0x492] & 0xfeU | 1);
        p_open_local[0x492] = (bool)(p_open_local[0x492] & 0xfd);
        if ((root_node->SharedFlags & 1U) == 0) {
          if (root_node->VisibleWindow == (ImGuiWindow *)p_open_local) {
            p_open_local[0x492] = (bool)(p_open_local[0x492] & 0xfdU | 2);
          }
          if ((*(uint *)(p_open_local + 0xc) & 0x1000000) != 0) {
            __assert_fail("(window->Flags & ImGuiWindowFlags_ChildWindow) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x3a87,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
          }
          *(uint *)(p_open_local + 0xc) = *(uint *)(p_open_local + 0xc) | 0x1010002;
          bVar2 = ImGuiDockNode::IsHiddenTabBar(root_node);
          if ((bVar2) || (bVar2 = ImGuiDockNode::IsNoTabBar(root_node), bVar2)) {
            *(uint *)(p_open_local + 0xc) = *(uint *)(p_open_local + 0xc) | 1;
          }
          else {
            *(uint *)(p_open_local + 0xc) = *(uint *)(p_open_local + 0xc) & 0xfffffffe;
          }
          if ((root_node->TabBar != (ImGuiTabBar *)0x0) &&
             (root_node->TabBar->CurrFrameVisible != -1)) {
            iVar4 = DockNodeGetTabOrder((ImGuiWindow *)p_open_local);
            *(short *)(p_open_local + 0x490) = (short)iVar4;
          }
          if ((((*(ushort *)&root_node->field_0xb8 >> 0xe & 1) != 0) ||
              (root_node->WantCloseTabId == *(ImGuiID *)(p_open_local + 8))) &&
             (ctx != (ImGuiContext *)0x0)) {
            ctx->Initialized = false;
          }
          IVar3 = ImGuiWindow::GetID(*(ImGuiWindow **)(*(long *)(p_open_local + 0x468) + 0x80),
                                     *(char **)p_open_local,(char *)0x0);
          *(ImGuiID *)(p_open_local + 0x88) = IVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
        {
            DockContextProcessUndockWindow(ctx, window);
        }
        else
        {
            window->DockIsActive = true;
            window->DockTabIsVisible = false;
        }
        return;
    }

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        window->DockIsActive = (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing);
        window->DockTabIsVisible = false;
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockTabIsVisible = false;
    if (node->SharedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the tab bar has been visible once.
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && node->TabBar->CurrFrameVisible != -1)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabId == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}